

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

dropt_error set_option_value(dropt_context *context,dropt_option *option,dropt_char *optionArgument)

{
  dropt_char *optionArgument_local;
  dropt_option *option_local;
  dropt_context *context_local;
  
  if (option != (dropt_option *)0x0) {
    if (option->handler == (dropt_option_handler_func)0x0) {
      dropt_misuse("No option handler specified.",
                   "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c"
                   ,0x3d8);
      context_local._4_4_ = 2;
    }
    else {
      context_local._4_4_ = (*option->handler)(context,option,optionArgument,option->dest);
    }
    return context_local._4_4_;
  }
  __assert_fail("option != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
                0x3d4,
                "dropt_error set_option_value(dropt_context *, const dropt_option *, const dropt_char *)"
               );
}

Assistant:

static dropt_error
set_option_value(dropt_context* context,
                 const dropt_option* option, const dropt_char* optionArgument)
{
    assert(option != NULL);

    if (option->handler == NULL)
    {
        DROPT_MISUSE("No option handler specified.");
        return dropt_error_bad_configuration;
    }

    return option->handler(context, option, optionArgument,
                           option->dest);
}